

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-room.c
# Opt level: O0

void append_entrance(loc grid)

{
  int iVar1;
  _Bool _Var2;
  int iVar3;
  loc grid2;
  loc_conflict *plVar4;
  loc_conflict lVar5;
  int local_4c;
  int local_24;
  wchar_t i;
  wchar_t alloc_n;
  int iStack_10;
  wchar_t ridx;
  loc grid_local;
  
  if (dun->cent_n < L'\x01') {
    return;
  }
  if ((int)(uint)z_info->level_room_max < dun->cent_n) {
    return;
  }
  iVar3 = dun->cent_n + L'\xffffffff';
  if (dun->ent_n[iVar3] < 0) {
    __assert_fail("dun->ent_n[ridx] >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/gen-room.c"
                  ,0x74,"void append_entrance(struct loc)");
  }
  if (dun->ent[iVar3] != (loc_conflict *)0x0) {
    plVar4 = dun->ent[iVar3];
    iVar1 = dun->ent_n[iVar3];
    grid2 = loc(-1,-1);
    _Var2 = loc_eq((loc)plVar4[iVar1],grid2);
    if (!_Var2) goto LAB_0016c4c8;
  }
  if (dun->ent_n[iVar3] < 1) {
    local_4c = 8;
  }
  else {
    local_4c = dun->ent_n[iVar3] << 1;
  }
  plVar4 = (loc_conflict *)mem_realloc(dun->ent[iVar3],(long)local_4c << 3);
  dun->ent[iVar3] = plVar4;
  local_24 = dun->ent_n[iVar3];
  while (local_24 = local_24 + 1, local_24 < local_4c + -1) {
    plVar4 = dun->ent[iVar3];
    lVar5 = (loc_conflict)loc(0,0);
    plVar4[local_24] = lVar5;
  }
  plVar4 = dun->ent[iVar3];
  lVar5 = (loc_conflict)loc(-1,-1);
  plVar4[local_4c + -1] = lVar5;
LAB_0016c4c8:
  plVar4 = dun->ent[iVar3];
  iVar1 = dun->ent_n[iVar3];
  plVar4[iVar1].x = grid.x;
  plVar4[iVar1].y = grid.y;
  dun->ent_n[iVar3] = dun->ent_n[iVar3] + 1;
  ridx = grid.y;
  iStack_10 = grid.x;
  dun->ent2room[ridx][iStack_10] = iVar3;
  return;
}

Assistant:

static void append_entrance(struct loc grid)
{
	int ridx;

	if (dun->cent_n <= 0 || dun->cent_n > z_info->level_room_max) return;
	ridx = dun->cent_n - 1;
	/* Expand allocated space if needed. */
	assert(dun->ent_n[ridx] >= 0);
	if (!dun->ent[ridx] ||
			loc_eq(dun->ent[ridx][dun->ent_n[ridx]], loc(-1, -1))) {
		int alloc_n = (dun->ent_n[ridx] > 0) ?
			2 * dun->ent_n[ridx] : 8;
		int i;

		dun->ent[ridx] = mem_realloc(dun->ent[ridx],
			alloc_n * sizeof(*dun->ent[ridx]));
		for (i = dun->ent_n[ridx] + 1; i < alloc_n - 1; ++i) {
			dun->ent[ridx][i] = loc(0, 0);
		}
		/* Add sentinel to track allocated size. */
		dun->ent[ridx][alloc_n - 1] = loc(-1, -1);
	}
	/* Record the entrance */
	dun->ent[ridx][dun->ent_n[ridx]] = grid;
	++dun->ent_n[ridx];
	dun->ent2room[grid.y][grid.x] = ridx;
}